

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

void __thiscall helics::FederateState::setOptionFlag(FederateState *this,int optionFlag,bool value)

{
  bool value_00;
  FederateStates FVar1;
  uint16_t uVar2;
  pointer this_00;
  pointer pTVar3;
  byte in_DL;
  int in_ESI;
  LogBuffer *in_RDI;
  bool in_stack_0000004f;
  InterfaceInfo *in_stack_00000050;
  FederateState *in_stack_00000168;
  undefined1 in_stack_ffffffffffffffdf;
  
  value_00 = (bool)(in_DL & 1);
  if (in_ESI == 0) {
    FVar1 = std::atomic::operator_cast_to_FederateStates((atomic<helics::FederateStates> *)0x4b7ed4)
    ;
    if (FVar1 != CREATED) {
      return;
    }
    *(bool *)((long)&(in_RDI->mBuffer).m_obj.
                     super__Deque_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_cur + 3) = value_00;
    if (value_00 == false) {
      return;
    }
    *(undefined1 *)
     ((long)&(in_RDI->mBuffer).m_obj.
             super__Deque_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur + 5) = 0;
    return;
  }
  if (in_ESI == 4) {
    FVar1 = std::atomic::operator_cast_to_FederateStates((atomic<helics::FederateStates> *)0x4b7e9c)
    ;
    if (FVar1 != CREATED) {
      return;
    }
    *(bool *)((long)&(in_RDI->mBuffer).m_obj.
                     super__Deque_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_cur + 5) = value_00;
    if (value_00 == false) {
      return;
    }
    *(undefined1 *)
     ((long)&(in_RDI->mBuffer).m_obj.
             super__Deque_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur + 3) = 0;
    return;
  }
  if (in_ESI == 6) {
LAB_004b7d3d:
    *(bool *)((long)&(in_RDI->mBuffer).m_obj.
                     super__Deque_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_cur + 1) = value_00;
  }
  else {
    if (in_ESI != 8) {
      if (in_ESI == 10) {
        in_RDI[4].mBuffer.m_mutex.super___shared_timed_mutex_base._M_rwlock.__size[0xc] = value_00;
        pTVar3 = std::
                 unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                 ::operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                               *)0x4b7f7b);
        TimeCoordinator::setOptionFlag(pTVar3,10,value_00);
        return;
      }
      if (in_ESI == 0x10) {
        if (value_00 == false) {
          *(undefined1 *)
           ((long)&(in_RDI->mBuffer).m_obj.
                   super__Deque_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur + 2) = 0;
          return;
        }
        FVar1 = std::atomic::operator_cast_to_FederateStates
                          ((atomic<helics::FederateStates> *)0x4b7e71);
        if (INITIALIZING < FVar1) {
          return;
        }
        *(undefined1 *)
         ((long)&(in_RDI->mBuffer).m_obj.
                 super__Deque_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur + 2) = 1;
        return;
      }
      if ((in_ESI == 0x1d) || (in_ESI == 0x1f)) {
        *(bool *)((long)&(in_RDI->mBuffer).m_obj.
                         super__Deque_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_first + 1) = value_00;
        return;
      }
      if (in_ESI == 0x26) {
        FVar1 = std::atomic::operator_cast_to_FederateStates
                          ((atomic<helics::FederateStates> *)0x4b7f0c);
        if (FVar1 != CREATED) {
          return;
        }
        *(bool *)((long)&(in_RDI->mBuffer).m_obj.
                         super__Deque_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_cur + 4) = value_00;
        return;
      }
      if (in_ESI == 0x43) {
        in_RDI[4].mBuffer.m_mutex.super___shared_timed_mutex_base._M_rwlock.__size[0xd] = value_00;
        return;
      }
      if (in_ESI == 0x48) {
        *(bool *)((long)&in_RDI[5].mBuffer.m_obj.
                         super__Deque_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Deque_impl_data._M_start._M_node + 5) = value_00;
        return;
      }
      if (in_ESI == 0x5d) {
        if ((value_00 != false) &&
           ((in_RDI[4].mBuffer.m_mutex.super___shared_timed_mutex_base._M_rwlock.__size[0xe] & 1U)
            == 0)) {
          generateProfilingMarker(in_stack_00000168);
        }
        in_RDI[4].mBuffer.m_mutex.super___shared_timed_mutex_base._M_rwlock.__size[0xe] = value_00;
        return;
      }
      if (in_ESI == 0x5f) {
        if (value_00 == false) {
          return;
        }
        if ((in_RDI[4].mBuffer.m_mutex.super___shared_timed_mutex_base._M_rwlock.__size[0xe] & 1U)
            == 0) {
          return;
        }
        generateProfilingMarker(in_stack_00000168);
        return;
      }
      if (in_ESI == 0x60) {
        in_RDI[4].mBuffer.m_mutex.super___shared_timed_mutex_base._M_rwlock.__size[0xf] = value_00;
        return;
      }
      if (in_ESI == 0x67) {
        FVar1 = std::atomic::operator_cast_to_FederateStates
                          ((atomic<helics::FederateStates> *)0x4b7f32);
        if (FVar1 != CREATED) {
          return;
        }
        *(bool *)((long)&(in_RDI->mBuffer).m_obj.
                         super__Deque_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_cur + 6) = value_00;
        return;
      }
      if (in_ESI == 0x6d) {
        *(bool *)((long)&(in_RDI->mBuffer).m_obj.
                         super__Deque_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_first + 2) = value_00;
        return;
      }
      if (in_ESI == 0x6e) {
        *(byte *)((long)&(in_RDI->mBuffer).m_obj.
                         super__Deque_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_first + 2) =
             (value_00 ^ 0xffU) & 1;
        return;
      }
      if (in_ESI == 0x114) {
        this_00 = std::unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_>::
                  operator->((unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_>
                              *)0x4b8098);
        LogManager::getLogBuffer(this_00);
        LogBuffer::enable(in_RDI,(bool)in_stack_ffffffffffffffdf);
        return;
      }
      if (in_ESI == 0x18d) {
        if (value_00 != false) {
          uVar2 = make_flags(2);
          std::__atomic_base<unsigned_short>::operator|=
                    ((__atomic_base<unsigned_short> *)
                     &in_RDI[8].mBuffer.m_obj.
                      super__Deque_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_map_size,uVar2);
          return;
        }
        uVar2 = make_flags(2);
        std::__atomic_base<unsigned_short>::operator&=
                  ((__atomic_base<unsigned_short> *)
                   &in_RDI[8].mBuffer.m_obj.
                    super__Deque_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map_size,uVar2 ^ 0xffff);
        return;
      }
      if (in_ESI == 0x192) {
        if (value_00 != false) {
          uVar2 = make_flags(8);
          std::__atomic_base<unsigned_short>::operator|=
                    ((__atomic_base<unsigned_short> *)
                     &in_RDI[8].mBuffer.m_obj.
                      super__Deque_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_map_size,uVar2);
          return;
        }
        uVar2 = make_flags(8);
        std::__atomic_base<unsigned_short>::operator&=
                  ((__atomic_base<unsigned_short> *)
                   &in_RDI[8].mBuffer.m_obj.
                    super__Deque_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map_size,uVar2 ^ 0xffff);
        return;
      }
      if (in_ESI == 0x19b) {
        return;
      }
      if (in_ESI == 0x19c) {
        if (value_00 != false) {
          uVar2 = make_flags(7);
          std::__atomic_base<unsigned_short>::operator|=
                    ((__atomic_base<unsigned_short> *)
                     &in_RDI[8].mBuffer.m_obj.
                      super__Deque_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_map_size,uVar2);
          return;
        }
        uVar2 = make_flags(7);
        std::__atomic_base<unsigned_short>::operator&=
                  ((__atomic_base<unsigned_short> *)
                   &in_RDI[8].mBuffer.m_obj.
                    super__Deque_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map_size,uVar2 ^ 0xffff);
        return;
      }
      if (in_ESI == 0x19e) {
        *(bool *)((long)&(in_RDI->mBuffer).m_obj.
                         super__Deque_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_cur + 7) = value_00;
        return;
      }
      if (in_ESI == 0x1bf) {
        *(bool *)&(in_RDI->mBuffer).m_obj.
                  super__Deque_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first = value_00;
        return;
      }
      if (in_ESI == 0x1c4) goto LAB_004b7d3d;
      if (in_ESI != 0x1c6) {
        pTVar3 = std::
                 unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                 ::operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                               *)0x4b80c1);
        TimeCoordinator::setOptionFlag(pTVar3,in_ESI,value_00);
        return;
      }
    }
    InterfaceInfo::setChangeUpdateFlag(in_stack_00000050,in_stack_0000004f);
  }
  return;
}

Assistant:

void FederateState::setOptionFlag(int optionFlag, bool value)
{
    switch (optionFlag) {
        case defs::Flags::ONLY_TRANSMIT_ON_CHANGE:
        case defs::Options::HANDLE_ONLY_TRANSMIT_ON_CHANGE:
            only_transmit_on_change = value;
            break;
        case defs::Flags::ONLY_UPDATE_ON_CHANGE:
        case defs::Options::HANDLE_ONLY_UPDATE_ON_CHANGE:
            interfaceInformation.setChangeUpdateFlag(value);
            break;
        case defs::Flags::STRICT_INPUT_TYPE_CHECKING:
            strict_input_type_checking = value;
            break;
        case defs::Flags::IGNORE_INPUT_UNIT_MISMATCH:
            ignore_unit_mismatch = value;
            break;
        case defs::Flags::SLOW_RESPONDING:
        case defs::Flags::DEBUGGING:
            mSlowResponding = value;
            break;
        case defs::Flags::PROFILING:
            if (value && !mProfilerActive) {
                generateProfilingMarker();
            }
            mProfilerActive = value;
            break;
        case defs::Flags::ALLOW_REMOTE_CONTROL:
            mAllowRemoteControl = value;
            break;
        case defs::Flags::DISABLE_REMOTE_CONTROL:
            mAllowRemoteControl = !value;
            break;
        case defs::Flags::PROFILING_MARKER:
            if (value && mProfilerActive) {
                generateProfilingMarker();
            }
            break;
        case defs::Flags::LOCAL_PROFILING_CAPTURE:
            mLocalProfileCapture = value;
            break;
        case defs::Flags::TERMINATE_ON_ERROR:
            terminate_on_error = value;
            break;
        case defs::Flags::REALTIME:
            if (value) {
                if (state < FederateStates::EXECUTING) {
                    realtime = true;
                }
            } else {
                realtime = false;
            }

            break;
        case defs::Flags::SOURCE_ONLY:
            if (state == FederateStates::CREATED) {
                mSourceOnly = value;
                if (value) {
                    observer = false;
                }
            }
            break;
        case defs::Flags::OBSERVER:
            if (state == FederateStates::CREATED) {
                observer = value;
                if (value) {
                    mSourceOnly = false;
                }
            }
            break;
        case defs::Flags::REENTRANT:
            if (state == FederateStates::CREATED) {
                reentrant = value;
            }
            break;
        case defs::Flags::CALLBACK_FEDERATE:
            if (state == FederateStates::CREATED) {
                mCallbackBased = value;
            }
            break;
        case defs::Flags::IGNORE_TIME_MISMATCH_WARNINGS:
            ignore_time_mismatch_warnings = value;
            break;
        case defs::Flags::WAIT_FOR_CURRENT_TIME_UPDATE:
            // this flag is needed in both locations
            wait_for_current_time = value;
            timeCoord->setOptionFlag(optionFlag, value);
            break;
        case defs::Options::BUFFER_DATA:
            break;
        case defs::Options::RECONNECTABLE:
            if (value) {
                interfaceFlags |= make_flags(reconnectable_flag);
            } else {
                interfaceFlags &= ~(make_flags(reconnectable_flag));
            }
            break;
        case defs::Flags::CONNECTIONS_REQUIRED:
            if (value) {
                interfaceFlags |= make_flags(required_flag);
            } else {
                interfaceFlags &= ~(make_flags(required_flag));
            }
            break;
        case defs::Flags::CONNECTIONS_OPTIONAL:
            if (value) {
                interfaceFlags |= make_flags(optional_flag);
            } else {
                interfaceFlags &= ~(make_flags(optional_flag));
            }
            break;
        case defs::Properties::LOG_BUFFER:
            mLogManager->getLogBuffer().enable(value);
            break;
        default:
            timeCoord->setOptionFlag(optionFlag, value);
            break;
    }
}